

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
          (DictionaryTypeHandlerBase<int> *this,Recycler *recycler,
          DictionaryTypeHandlerBase<int> *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  nullptr_t local_28;
  DictionaryTypeHandlerBase<int> *local_20;
  DictionaryTypeHandlerBase<int> *typeHandler_local;
  Recycler *recycler_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  local_20 = typeHandler;
  typeHandler_local = (DictionaryTypeHandlerBase<int> *)recycler;
  recycler_local = (Recycler *)this;
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,&typeHandler->super_DynamicTypeHandler);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e46568
  ;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->propertyMap);
  this->nextPropertyIndex = local_20->nextPropertyIndex;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::WriteBarrierPtr
            (&this->singletonInstance,&local_28);
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  bVar3 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&local_20->super_DynamicTypeHandler);
  if (bVar2 != bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x40,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar5 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&local_20->propertyMap);
  pBVar5 = JsUtil::
           BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Clone(pBVar5);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->propertyMap,pBVar5);
  return;
}

Assistant:

DictionaryTypeHandlerBase<T>::DictionaryTypeHandlerBase(Recycler* recycler, DictionaryTypeHandlerBase * typeHandler) :
        DynamicTypeHandler(typeHandler),
        nextPropertyIndex(typeHandler->nextPropertyIndex)
#if ENABLE_FIXED_FIELDS
        , singletonInstance(nullptr)
#endif
    {
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
        propertyMap = typeHandler->propertyMap->Clone();
    }